

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::AddData
          (ChISO2631_Vibration_SeatCushionLogger *this,double speed,double acc_x,double acc_y,
          double acc_z)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  local_40 = acc_x;
  local_38 = acc_y;
  local_30 = acc_z;
  local_28 = speed;
  local_48 = ChSineStep(this->m_logging_time,this->m_tstart1,0.0,this->m_tstart2,1.0);
  std::vector<double,_std::allocator<double>_>::push_back(&this->m_data_speed,&local_28);
  local_50 = local_48 * local_40;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->m_data_acc_x,&local_50);
  local_50 = local_48 * local_38;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->m_data_acc_y,&local_50);
  local_50 = local_48 * local_30;
  local_48 = local_50;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->m_data_acc_z,&local_50);
  local_50 = local_48 * 3.280839895;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_acc_ap_z,&local_50);
  local_50 = ChISO2631_1_Wd::Filter
                       (&this->m_filter_wd_x,
                        (this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_acc_x_wd,&local_50);
  local_50 = ChISO2631_1_Wd::Filter
                       (&this->m_filter_wd_y,
                        (this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_acc_y_wd,&local_50);
  local_50 = ChISO2631_1_Wk::Filter
                       (&this->m_filter_wk_z,
                        (this->m_data_acc_z).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_acc_z_wk,&local_50);
  dVar1 = (this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  local_50 = ChFilterI::Filter(&this->m_filter_int_aw_x,dVar1 * dVar1);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->m_data_aw_x_i,&local_50)
  ;
  dVar1 = (this->m_data_acc_y_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  local_50 = ChFilterI::Filter(&this->m_filter_int_aw_y,dVar1 * dVar1);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->m_data_aw_y_i,&local_50)
  ;
  dVar1 = (this->m_data_acc_z_wk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  local_50 = ChFilterI::Filter(&this->m_filter_int_aw_z,dVar1 * dVar1);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->m_data_aw_z_i,&local_50)
  ;
  dVar1 = pow((this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1],4.0);
  local_50 = ChFilterI::Filter(&this->m_filter_int_vdv_x,dVar1);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_vdv_x_i,&local_50);
  dVar1 = pow((this->m_data_acc_y_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1],4.0);
  local_50 = ChFilterI::Filter(&this->m_filter_int_vdv_y,dVar1);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_vdv_y_i,&local_50);
  dVar1 = pow((this->m_data_acc_z_wk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1],4.0);
  local_50 = ChFilterI::Filter(&this->m_filter_int_vdv_z,dVar1);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_vdv_z_i,&local_50);
  if ((this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_aw_x_avg,&local_50);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_aw_y_avg,&local_50);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_aw_z_avg,&local_50);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_vdv_x_avg,&local_50);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_vdv_y_avg,&local_50);
    local_50 = 0.0;
  }
  else {
    auVar2._0_8_ = (this->m_data_aw_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1] / this->m_logging_time;
    auVar2._8_8_ = 0;
    if (auVar2._0_8_ < 0.0) {
      local_50 = sqrt(auVar2._0_8_);
    }
    else {
      auVar2 = vsqrtsd_avx(auVar2,auVar2);
      local_50 = auVar2._0_8_;
    }
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_aw_x_avg,&local_50);
    auVar3._0_8_ = (this->m_data_aw_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1] / this->m_logging_time;
    auVar3._8_8_ = 0;
    if (auVar3._0_8_ < 0.0) {
      local_50 = sqrt(auVar3._0_8_);
    }
    else {
      auVar2 = vsqrtsd_avx(auVar3,auVar3);
      local_50 = auVar2._0_8_;
    }
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_aw_y_avg,&local_50);
    auVar4._0_8_ = (this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1] / this->m_logging_time;
    auVar4._8_8_ = 0;
    if (auVar4._0_8_ < 0.0) {
      local_50 = sqrt(auVar4._0_8_);
    }
    else {
      auVar2 = vsqrtsd_avx(auVar4,auVar4);
      local_50 = auVar2._0_8_;
    }
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_aw_z_avg,&local_50);
    local_50 = pow((this->m_data_vdv_x_i).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1] / this->m_logging_time,0.25);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_vdv_x_avg,&local_50);
    local_50 = pow((this->m_data_vdv_y_i).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1] / this->m_logging_time,0.25);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->m_data_vdv_y_avg,&local_50);
    local_50 = pow((this->m_data_vdv_z_i).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1] / this->m_logging_time,0.25);
  }
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&this->m_data_vdv_z_avg,&local_50);
  this->m_logging_time = this->m_step + this->m_logging_time;
  return;
}

Assistant:

void ChISO2631_Vibration_SeatCushionLogger::AddData(double speed, double acc_x, double acc_y, double acc_z) {
    const double meter_to_ft = 3.280839895;
    double startFactor = ChSineStep(m_logging_time, m_tstart1, 0.0, m_tstart2, 1.0);

    m_data_speed.push_back(speed);

    m_data_acc_x.push_back(startFactor * acc_x);
    m_data_acc_y.push_back(startFactor * acc_y);
    m_data_acc_z.push_back(startFactor * acc_z);

    m_data_acc_ap_z.push_back(startFactor * acc_z * meter_to_ft);

    m_data_acc_x_wd.push_back(m_filter_wd_x.Filter(m_data_acc_x.back()));
    m_data_acc_y_wd.push_back(m_filter_wd_y.Filter(m_data_acc_y.back()));
    m_data_acc_z_wk.push_back(m_filter_wk_z.Filter(m_data_acc_z.back()));

    m_data_aw_x_i.push_back(m_filter_int_aw_x.Filter(pow(m_data_acc_x_wd.back(), 2.0)));
    m_data_aw_y_i.push_back(m_filter_int_aw_y.Filter(pow(m_data_acc_y_wd.back(), 2.0)));
    m_data_aw_z_i.push_back(m_filter_int_aw_z.Filter(pow(m_data_acc_z_wk.back(), 2.0)));

    m_data_vdv_x_i.push_back(m_filter_int_vdv_x.Filter(pow(m_data_acc_x_wd.back(), 4.0)));
    m_data_vdv_y_i.push_back(m_filter_int_vdv_y.Filter(pow(m_data_acc_y_wd.back(), 4.0)));
    m_data_vdv_z_i.push_back(m_filter_int_vdv_z.Filter(pow(m_data_acc_z_wk.back(), 4.0)));

    if (m_data_aw_x_avg.size() == 0) {
        m_data_aw_x_avg.push_back(0.0);
        m_data_aw_y_avg.push_back(0.0);
        m_data_aw_z_avg.push_back(0.0);

        m_data_vdv_x_avg.push_back(0.0);
        m_data_vdv_y_avg.push_back(0.0);
        m_data_vdv_z_avg.push_back(0.0);
    } else {
        m_data_aw_x_avg.push_back(sqrt(m_data_aw_x_i.back() / m_logging_time));
        m_data_aw_y_avg.push_back(sqrt(m_data_aw_y_i.back() / m_logging_time));
        m_data_aw_z_avg.push_back(sqrt(m_data_aw_z_i.back() / m_logging_time));

        m_data_vdv_x_avg.push_back(pow(m_data_vdv_x_i.back() / m_logging_time, 0.25));
        m_data_vdv_y_avg.push_back(pow(m_data_vdv_y_i.back() / m_logging_time, 0.25));
        m_data_vdv_z_avg.push_back(pow(m_data_vdv_z_i.back() / m_logging_time, 0.25));
    }

    m_logging_time += m_step;
}